

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int curl_strequal(char *first,char *second)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar1 = first == (char *)0x0 && second == (char *)0x0;
  }
  else {
    bVar2 = *first;
    if (bVar2 == 0) {
      bVar1 = true;
    }
    else {
      pbVar3 = (byte *)(first + 1);
      do {
        uVar4 = (ulong)(byte)*second;
        bVar1 = uVar4 != 0;
        if (uVar4 == 0) break;
        if (""[bVar2] != ""[uVar4]) {
          bVar1 = false;
          goto LAB_00679b0a;
        }
        second = (char *)((byte *)second + 1);
        bVar2 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar2 != 0);
    }
    bVar1 = (bool)(*second != 0U ^ bVar1);
  }
LAB_00679b0a:
  return (int)bVar1;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return (NULL == first && NULL == second);
}